

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O0

TPZTransform<double> *
pztopology::Pr<pztopology::TPZPoint>::SideToSideTransform(int sidefrom,int sideto)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  void *pvVar4;
  int64_t iVar5;
  TPZTransform<double> *this;
  int in_EDX;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZTransform<double> toside;
  TPZTransform<double> toelement;
  int dto;
  int dfr;
  int is;
  int nhigh;
  TPZStack<int,_10> highsides;
  TPZTransform<double> *trans;
  TPZTransform<double> *in_stack_fffffffffffff708;
  TPZTransform<double> *in_stack_fffffffffffff710;
  TPZStack<int,_10> *in_stack_fffffffffffff720;
  TPZStack<int,_10> *in_stack_fffffffffffff738;
  undefined8 in_stack_fffffffffffff740;
  undefined8 in_stack_fffffffffffff748;
  TPZVec<int> *pTVar6;
  TPZTransform<double> *pTVar7;
  int in_stack_fffffffffffff93c;
  int in_stack_fffffffffffff96c;
  int local_6c;
  TPZVec<int> local_58 [2];
  int local_10;
  int local_c;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffff748 >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffff740 >> 0x20);
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((((in_ESI < 0) || (2 < in_ESI)) || (in_EDX < 0)) || (2 < in_EDX)) {
    pTVar7 = in_RDI;
    poVar3 = std::operator<<((ostream *)&std::cerr,"Pr<TFather>::HigherDimensionSides sidefrom ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,' ');
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_10);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    TPZTransform<double>::TPZTransform(pTVar7,iVar2);
  }
  else if (in_ESI == in_EDX) {
    pTVar7 = in_RDI;
    SideDimension((int)in_stack_fffffffffffff710);
    TPZTransform<double>::TPZTransform(pTVar7,iVar2);
  }
  else if (in_ESI == 2) {
    TransformElementToSide(in_stack_fffffffffffff93c);
  }
  else {
    pTVar6 = local_58;
    pTVar7 = in_RDI;
    TPZStack<int,_10>::TPZStack(in_stack_fffffffffffff720);
    HigherDimensionSides(iVar1,in_stack_fffffffffffff738);
    iVar5 = TPZVec<int>::NElements(local_58);
    for (local_6c = 0; local_6c < (int)iVar5; local_6c = local_6c + 1) {
      this = (TPZTransform<double> *)TPZVec<int>::operator[](local_58,(long)local_6c);
      if (*(int *)&(this->super_TPZSavable)._vptr_TPZSavable == local_10) {
        iVar1 = SideDimension((int)in_stack_fffffffffffff710);
        iVar2 = SideDimension((int)in_stack_fffffffffffff710);
        TPZTransform<double>::TPZTransform(pTVar7,(int)((ulong)pTVar6 >> 0x20),(int)pTVar6);
        TPZTransform<double>::TPZTransform(pTVar7,(int)((ulong)pTVar6 >> 0x20),(int)pTVar6);
        TPZTransform<double>::TPZTransform(pTVar7,(int)((ulong)pTVar6 >> 0x20),(int)pTVar6);
        TransformSideToElement(in_stack_fffffffffffff96c);
        TPZTransform<double>::operator=(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x14e8bcd);
        TransformElementToSide(in_stack_fffffffffffff93c);
        TPZTransform<double>::operator=(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x14e8c07);
        TPZTransform<double>::Multiply(this,(TPZTransform<double> *)CONCAT44(iVar1,iVar2));
        TPZTransform<double>::operator=(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x14e8c3e);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x14e8c5b);
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x14e8c68);
        goto LAB_014e8e1b;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "Pr<TFather>::SideToSideTransform highside not found sidefrom ");
    iVar1 = (int)((ulong)pTVar6 >> 0x20);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
    poVar3 = std::operator<<(poVar3,' ');
    pvVar4 = (void *)std::ostream::operator<<(poVar3,local_10);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    TPZTransform<double>::TPZTransform(pTVar7,iVar1);
LAB_014e8e1b:
    TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x14e8e28);
  }
  return in_RDI;
}

Assistant:

TPZTransform<> Pr<TFather>::SideToSideTransform(int sidefrom, int sideto)
	{
		if(sidefrom <0 || sidefrom >= NSides || sideto <0 || sideto >= NSides) {
			PZError << "Pr<TFather>::HigherDimensionSides sidefrom "<< sidefrom << 
			' ' << sideto << endl;
			return TPZTransform<>(0);
		}
		if(sidefrom == sideto) {
			return TPZTransform<>(SideDimension(sidefrom));
		}
		if(sidefrom == NSides-1) {
			return TransformElementToSide(sideto);
		}
		TPZStack<int> highsides;
		HigherDimensionSides(sidefrom,highsides);
		int nhigh = highsides.NElements();
		int is;
		for(is=0; is<nhigh; is++) {
			if(highsides[is] == sideto) {
				int dfr = SideDimension(sidefrom);
				int dto = SideDimension(sideto);
				TPZTransform<> trans(dto,dfr),toelement(Dimension,sidefrom),toside(sideto,Dimension);
				toelement = TransformSideToElement(sidefrom);
				toside = TransformElementToSide(sideto);
				trans = toside.Multiply(toelement);
				return trans;
			}
		}
		PZError << "Pr<TFather>::SideToSideTransform highside not found sidefrom "
		<< sidefrom << ' ' << sideto << endl;
		return TPZTransform<>(0);
	}